

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O1

void __thiscall
Test::HTMLOutput::generateSuitesTable(HTMLOutput *this,ostream *stream,bool includePassed)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  double dVar6;
  long local_48;
  undefined8 local_40;
  undefined2 local_38;
  undefined1 local_36;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,
             "<table id=\'top\' class=\'suites\'><tr><th>Suite</th><th># Tests</th><th>Passed Tests</th><th>Duration</th></tr>"
             ,0x6c);
  cVar3 = (char)stream;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  puVar5 = *(undefined8 **)(this + 8);
  if (puVar5 != *(undefined8 **)(this + 0x10)) {
    do {
      if ((includePassed) || (*(int *)((long)puVar5 + 0x44) != *(int *)(puVar5 + 8))) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,"<tr><td><a href=\'#suite_",0x18);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)*puVar5,puVar5[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'>",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)*puVar5,puVar5[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</a></td>",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<td>",4);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</td>",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<td class=\'",0xb);
        uVar1 = *(uint *)(puVar5 + 8);
        uVar2 = *(uint *)((long)puVar5 + 0x44);
        if (uVar1 == uVar2) {
          local_40 = 0x65737361506c6c61;
LAB_0011c9a8:
          local_48 = 9;
          local_38 = 100;
        }
        else {
          if (uVar2 < (uint)((ulong)uVar1 * 3 >> 2)) {
            if (uVar2 < uVar1 >> 1) {
              if (uVar2 < uVar1 >> 2) {
                local_40 = 0x6573736150776566;
                goto LAB_0011c9a8;
              }
              local_40 = 0x73736150656d6f73;
            }
            else {
              local_40 = 0x73736150796e616d;
            }
          }
          else {
            local_40 = 0x7373615074736f6d;
          }
          local_38 = 0x6465;
          local_48 = 10;
          local_36 = 0;
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)&local_40,local_48);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'>",2);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
        dVar6 = Output::prettifyPercentage
                          ((Output *)this,(double)*(uint *)((long)puVar5 + 0x44),
                           (double)*(uint *)(puVar5 + 8));
        poVar4 = std::ostream::_M_insert<double>(dVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%)</td>",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<td>",4);
        poVar4 = std::ostream::_M_insert<double>((double)(long)puVar5[4] / 1000.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ms (",5);
        poVar4 = std::ostream::_M_insert<double>((double)(long)puVar5[4] / 1000000.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," s)</td>",8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</tr>",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      puVar5 = puVar5 + 9;
    } while (puVar5 != *(undefined8 **)(this + 0x10));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"</table>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void HTMLOutput::generateSuitesTable(std::ostream &stream, bool includePassed) {
  // header
  stream
      << "<table id='top' class='suites'><tr><th>Suite</th><th># Tests</th><th>Passed Tests</th><th>Duration</th></tr>"
      << std::endl;
  // content
  auto info = suites.begin();
  while (info != suites.end()) {
    if (includePassed || info->numPositiveTests != info->numTests) {
      stream << "<tr><td><a href='#suite_" << info->suiteName << "'>" << info->suiteName << "</a></td>"
             << "<td>" << info->numTests << "</td>"
             << "<td class='" << getCssClass(info->numTests, info->numPositiveTests) << "'>" << info->numPositiveTests
             << " (" << prettifyPercentage(info->numPositiveTests, info->numTests) << "%)</td>"
             << "<td>" << static_cast<double>(info->suiteDuration.count()) / 1000.0 << " ms ("
             << static_cast<double>(info->suiteDuration.count()) / 1000000.0 << " s)</td>"
             << "</tr>" << std::endl;
    }
    ++info;
  }
  stream << "</table>" << std::endl;
}